

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O2

void P2Pt::invm3x3<double>(double (*input_m) [3] [3],double (*output_m) [3] [3])

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar13;
  double dVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar12 [32];
  
  auVar1 = *(undefined1 (*) [32])((*input_m)[0] + 1);
  auVar2 = *(undefined1 (*) [32])((*input_m)[1] + 2);
  dVar13 = (*input_m)[0][1];
  dVar15 = (*input_m)[0][2];
  auVar10._0_8_ = dVar13 * (*input_m)[1][2];
  auVar10._8_8_ = dVar15 * (*input_m)[2][0];
  auVar10 = vshufpd_avx(auVar10,auVar10,1);
  dVar9 = (*input_m)[0][0];
  auVar11._8_8_ = dVar9;
  auVar11._0_8_ = dVar9;
  auVar12._16_8_ = dVar9;
  auVar12._0_16_ = auVar11;
  auVar12._24_8_ = dVar9;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (*input_m)[2][2];
  auVar10 = vfmsub231sd_fma(auVar10,auVar11,auVar3);
  auVar7 = vpermi2pd_avx512vl(_DAT_001132a0,auVar2,auVar1);
  auVar7 = vblendpd_avx(auVar7,auVar12,8);
  auVar16._0_8_ = auVar1._0_8_ * auVar7._0_8_;
  auVar16._8_8_ = auVar1._8_8_ * auVar7._8_8_;
  auVar16._16_8_ = auVar1._16_8_ * auVar7._16_8_;
  auVar16._24_8_ = auVar1._24_8_ * auVar7._24_8_;
  auVar8 = vpermi2pd_avx512vl(_DAT_001132c0,auVar1,auVar2);
  auVar7 = vpermpd_avx2(auVar2,0x4b);
  auVar17._0_8_ = auVar7._0_8_ * auVar8._0_8_;
  auVar17._8_8_ = auVar7._8_8_ * auVar8._8_8_;
  auVar17._16_8_ = auVar7._16_8_ * auVar8._16_8_;
  auVar17._24_8_ = auVar7._24_8_ * auVar8._24_8_;
  auVar7 = vblendpd_avx(auVar1,auVar2,0xc);
  auVar8 = vperm2f128_avx(auVar2,auVar1,0x31);
  auVar7 = vshufpd_avx(auVar8,auVar7,0xc);
  auVar4 = vperm2f128_avx(auVar2,auVar1,0x20);
  auVar8 = vshufpd_avx(auVar4,auVar8,6);
  auVar5 = vfnmadd213pd_fma(auVar8,auVar7,auVar17);
  auVar7 = vpermpd_avx2(auVar16,0xc9);
  auVar8 = vpermi2pd_avx512vl(_DAT_001132e0,auVar12,auVar1);
  auVar1 = vshufpd_avx(auVar2,auVar4,2);
  auVar6 = vfnmadd213pd_fma(auVar1,auVar8,auVar7);
  auVar3 = vunpckhpd_avx((undefined1  [16])0x0,auVar6);
  dVar13 = auVar3._0_8_ * dVar13;
  dVar15 = auVar3._8_8_ * dVar15;
  auVar14._0_8_ = dVar13 + dVar15;
  auVar14._8_8_ = dVar13 + dVar15;
  auVar3 = vfmadd231sd_fma(auVar14,auVar11,auVar5);
  dVar9 = 1.0 / auVar3._0_8_;
  (*output_m)[0][0] = auVar5._0_8_ * dVar9;
  (*output_m)[0][1] = auVar5._8_8_ * dVar9;
  (*output_m)[0][2] = dVar9 * 0.0;
  (*output_m)[1][0] = dVar9 * 0.0;
  (*output_m)[1][1] = dVar9 * auVar10._0_8_;
  (*output_m)[1][2] = dVar9 * auVar6._0_8_;
  (*output_m)[2][0] = dVar9 * auVar6._8_8_;
  (*output_m)[2][1] = dVar9 * 0.0;
  (*output_m)[2][2] = dVar9 * 0.0;
  return;
}

Assistant:

inline void
invm3x3(const T (&input_m)[3][3], T (&output_m)[3][3])
{
	// 3x3 MATRIX INVERSION ALGORITHM
	//             -1               T
	//  -1  [a b c]      1   [A B C]      1   [A D G]
	// M  = [d e f] = ------ [D E F] = ------ [B E H]
	//      [g h i]   det(M) [G H I]   det(M) [C F I]
	//
	// A =  (ei - fh), D = -(bi - ch), G =  (bf - ce),
	// B = -(di - fg), E =  (ai - cg), H = -(af - cd),
	// C =  (dh - eg), F = -(ah - bg), I =  (ae - bd).

	const T 
	a = input_m[0][0], b = input_m[0][1], c = input_m[0][2],
	d = input_m[1][0], e = input_m[1][1], f = input_m[1][2],
	g = input_m[2][0], h = input_m[2][1], i = input_m[2][2];

	const T 
	A =  (e*i - f*h), B = -(d*i - f*g), C =  (d*h - e*g),
	D = -(b*i - c*h), E =  (a*i - c*g), F = -(a*h - b*g),
	G =  (b*f - c*e), H = -(a*f - c*d), I =  (a*e - b*d);

	const T invdet_M = 1. / (a*A + b*B + c*C);
	output_m[0][0] = invdet_M * A; output_m[0][1] = invdet_M * D; output_m[0][2] = invdet_M * G;
	output_m[1][0] = invdet_M * B; output_m[1][1] = invdet_M * E; output_m[1][2] = invdet_M * H;
	output_m[2][0] = invdet_M * C; output_m[2][1] = invdet_M * F; output_m[2][2] = invdet_M * I;
}